

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O3

defyx_cache * defyx_alloc_cache(defyx_flags flags)

{
  char cVar1;
  defyx_cache *pdVar2;
  JitCompilerX86 *pJVar3;
  uint8_t *puVar4;
  undefined *puVar5;
  int extraout_EDX;
  code *UNRECOVERED_JUMPTABLE;
  defyx_cache *unaff_R12;
  defyx_flags dVar6;
  
  pdVar2 = (defyx_cache *)operator_new(0x2130);
  memset(pdVar2,0,0x2130);
  (pdVar2->cacheKey)._M_dataplus._M_p = (pointer)&(pdVar2->cacheKey).field_2;
  (pdVar2->cacheKey).field_2._M_local_buf[0] = '\0';
  dVar6 = flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES);
  cVar1 = (char)(&switchD_00115aee::switchdataD_001267ec)[dVar6];
  switch(dVar6) {
  case RANDOMX_FLAG_DEFAULT:
    pdVar2->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    pdVar2->jit = (JitCompiler *)0x0;
    pdVar2->initialize = defyx::initCache;
    pdVar2->datasetInit = defyx::initDataset;
    puVar4 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x8000000);
    break;
  case RANDOMX_FLAG_LARGE_PAGES:
    pdVar2->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    pdVar2->jit = (JitCompiler *)0x0;
    pdVar2->initialize = defyx::initCache;
    pdVar2->datasetInit = defyx::initDataset;
    puVar4 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x8000000);
    break;
  default:
    operator_delete(unaff_R12);
    if (extraout_EDX == 1) {
      __cxa_begin_catch(&switchD_00115aee::switchdataD_001267ec);
      if (pdVar2 != (defyx_cache *)0x0) {
        defyx_release_cache(pdVar2);
      }
      __cxa_end_catch();
      return (defyx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_00115aee::switchdataD_001267ec);
  case RANDOMX_FLAG_JIT:
    pdVar2->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    pJVar3 = (JitCompilerX86 *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(pJVar3);
    pdVar2->jit = pJVar3;
    pdVar2->initialize = defyx::initCacheCompile;
    pdVar2->datasetInit = (DatasetInitFunc *)pJVar3->code;
    puVar4 = (uint8_t *)defyx::AlignedAllocator<64UL>::allocMemory(0x8000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    pdVar2->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    pJVar3 = (JitCompilerX86 *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(pJVar3);
    pdVar2->jit = pJVar3;
    pdVar2->initialize = defyx::initCacheCompile;
    pdVar2->datasetInit = (DatasetInitFunc *)pJVar3->code;
    puVar4 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x8000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    pdVar2 = (defyx_cache *)(*UNRECOVERED_JUMPTABLE)();
    return pdVar2;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    std::thread::
    _State_impl<std::thread::_Invoker<std::tuple<void(*)(defyx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),defyx_vm*,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int,unsigned_int,int>>>
    ::typeinfo_name[0x12] = cVar1 + 'K';
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    unaff_R12->memory = (uint8_t *)0x141158;
    defyx::JitCompilerX86::JitCompilerX86
              ((JitCompilerX86 *)(unaff_R12->programs[0].programBuffer + 0x80));
    puVar5 = &defyx::CompiledLightVm<defyx::LargePageAllocator,true>::vtable;
    goto LAB_00116361;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    cRam000000000024cfd8 =
         (cRam000000000024cfd8 + '\x14') -
         (0xffed9813 < (&switchD_00115aee::switchdataD_001267ec)[dVar6]);
    switchD_00115aee::switchdataD_001267ec._0_1_ = 0xf0;
    unaff_R12->memory = (uint8_t *)&PTR__CompiledVm_00130b90;
    defyx::JitCompilerX86::JitCompilerX86
              ((JitCompilerX86 *)(unaff_R12->programs[0].programBuffer + 0x80));
    goto LAB_00116369;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    unaff_R12->memory = (uint8_t *)0x141451;
    defyx::JitCompilerX86::JitCompilerX86
              ((JitCompilerX86 *)(unaff_R12->programs[0].programBuffer + 0x80));
    puVar5 = &defyx::CompiledLightVm<defyx::LargePageAllocator,false>::vtable;
LAB_00116361:
    unaff_R12->memory = puVar5 + 0x10;
LAB_00116369:
    puVar4 = unaff_R12->memory;
    if ((ulong)dVar6 != 0) {
      (**(code **)(puVar4 + 0x28))();
      std::__cxx11::string::_M_assign((string *)(unaff_R12->programs[0].programBuffer + 0x7c));
      puVar4 = unaff_R12->memory;
    }
    if (pdVar2 != (defyx_cache *)0x0) {
      (**(code **)(puVar4 + 0x20))();
      puVar4 = unaff_R12->memory;
    }
    (**(code **)(puVar4 + 0x10))();
    return unaff_R12;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    std::thread::
    _State_impl<std::thread::_Invoker<std::tuple<void(*)(defyx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),defyx_vm*,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int,unsigned_int,int>>>
    ::typeinfo_name[0x12] = cVar1 + 'K';
    halt_baddata();
  }
  pdVar2->memory = puVar4;
  return pdVar2;
}

Assistant:

defyx_cache *defyx_alloc_cache(defyx_flags flags) {
		defyx_cache *cache;

		try {
			cache = new defyx_cache();
			switch (flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES)) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				defyx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}